

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontSym.cpp
# Opt level: O1

void __thiscall
TPZFrontSym<std::complex<double>_>::Compress(TPZFrontSym<std::complex<double>_> *this)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  long *plVar3;
  long *plVar4;
  int64_t iVar5;
  complex<double> *pcVar6;
  undefined8 uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  TPZStack<long,_10> from;
  TPZManVector<long,_10> local_90;
  
  TPZStack<long,_10>::TPZStack((TPZStack<long,_10> *)&local_90);
  if (0 < (this->super_TPZFront<std::complex<double>_>).fFront) {
    lVar15 = 0;
    do {
      if ((this->super_TPZFront<std::complex<double>_>).fGlobal.super_TPZVec<long>.fStore[lVar15] !=
          -1) {
        TPZStack<long,_10>::Push((TPZStack<long,_10> *)&local_90,lVar15);
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 < (this->super_TPZFront<std::complex<double>_>).fFront);
  }
  if (local_90.super_TPZVec<long>.fNElements < 1) {
    lVar15 = 0;
  }
  else {
    plVar3 = (this->super_TPZFront<std::complex<double>_>).fGlobal.super_TPZVec<long>.fStore;
    plVar4 = (this->super_TPZFront<std::complex<double>_>).fLocal.fStore;
    lVar10 = 0;
    do {
      lVar15 = plVar3[local_90.super_TPZVec<long>.fStore[lVar10]];
      plVar3[lVar10] = lVar15;
      plVar4[lVar15] = lVar10;
      lVar10 = lVar10 + 1;
      lVar15 = local_90.super_TPZVec<long>.fNElements;
    } while (local_90.super_TPZVec<long>.fNElements != lVar10);
  }
  if (lVar15 < (this->super_TPZFront<std::complex<double>_>).fGlobal.super_TPZVec<long>.fNElements)
  {
    plVar3 = (this->super_TPZFront<std::complex<double>_>).fGlobal.super_TPZVec<long>.fStore;
    lVar10 = lVar15;
    do {
      plVar3[lVar10] = -1;
      lVar10 = lVar10 + 1;
    } while (lVar10 < (this->super_TPZFront<std::complex<double>_>).fGlobal.super_TPZVec<long>.
                      fNElements);
  }
  if ((this->super_TPZFront<std::complex<double>_>).fFree.super_TPZManVector<int,_10>.
      super_TPZVec<int>.fNElements + local_90.super_TPZVec<long>.fNElements !=
      (this->super_TPZFront<std::complex<double>_>).fFront) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"TPZFront.Compress inconsistent data structure\n",0x2e);
  }
  iVar5 = (this->super_TPZFront<std::complex<double>_>).fFront;
  (this->super_TPZFront<std::complex<double>_>).fFront = local_90.super_TPZVec<long>.fNElements;
  TPZManVector<int,_10>::Resize
            (&(this->super_TPZFront<std::complex<double>_>).fFree.super_TPZManVector<int,_10>,0);
  TPZManVector<long,_10>::Resize
            (&(this->super_TPZFront<std::complex<double>_>).fGlobal,
             (this->super_TPZFront<std::complex<double>_>).fFront);
  if ((this->super_TPZFront<std::complex<double>_>).fData.fNElements != 0) {
    if (local_90.super_TPZVec<long>.fNElements < 1) {
      local_90.super_TPZVec<long>.fNElements = 0;
    }
    else {
      lVar10 = 1;
      lVar8 = 0;
      do {
        lVar9 = 0;
        do {
          lVar12 = local_90.super_TPZVec<long>.fStore[lVar9];
          lVar11 = local_90.super_TPZVec<long>.fStore[lVar8];
          lVar13 = lVar11;
          if (lVar11 < lVar12) {
            lVar13 = lVar12;
          }
          if (lVar12 < lVar11) {
            lVar11 = lVar12;
          }
          lVar13 = (lVar13 + 1) * lVar13;
          pcVar6 = (this->super_TPZFront<std::complex<double>_>).fData.fStore;
          lVar12 = lVar8;
          if (lVar8 < lVar9) {
            lVar12 = lVar9;
          }
          lVar14 = lVar8;
          if (lVar9 < lVar8) {
            lVar14 = lVar9;
          }
          puVar1 = (undefined8 *)
                   (pcVar6[lVar11]._M_value + (lVar13 - (lVar13 >> 0x3f) & 0xfffffffffffffffeU) * 8)
          ;
          uVar7 = puVar1[1];
          puVar2 = (undefined8 *)
                   (pcVar6[lVar14]._M_value + ((lVar12 + 1) * lVar12 & 0xfffffffffffffffeU) * 8);
          *puVar2 = *puVar1;
          puVar2[1] = uVar7;
          lVar9 = lVar9 + 1;
        } while (lVar10 != lVar9);
        lVar8 = lVar8 + 1;
        lVar10 = lVar10 + 1;
      } while (lVar8 != local_90.super_TPZVec<long>.fNElements);
    }
    lVar10 = (long)(int)iVar5;
    if (local_90.super_TPZVec<long>.fNElements < lVar10) {
      do {
        lVar8 = lVar15 + 1;
        lVar9 = 0;
        do {
          lVar12 = lVar15;
          if (lVar15 < lVar9) {
            lVar12 = lVar9;
          }
          lVar11 = lVar15;
          if (lVar9 < lVar15) {
            lVar11 = lVar9;
          }
          lVar9 = lVar9 + 1;
          puVar1 = (undefined8 *)
                   ((this->super_TPZFront<std::complex<double>_>).fData.fStore[lVar11]._M_value +
                   ((lVar12 + 1) * lVar12 & 0xfffffffffffffffeU) * 8);
          *puVar1 = 0;
          puVar1[1] = 0;
        } while (lVar8 != lVar9);
        lVar15 = lVar8;
      } while (lVar8 != lVar10);
    }
  }
  TPZManVector<long,_10>::~TPZManVector(&local_90);
  return;
}

Assistant:

void TPZFrontSym<TVar>::Compress(){
	//	PrintGlobal("Before COmpress",output);
	//	Print("Before Compress", cout);
	TPZStack <int64_t> from;
	int64_t nfound;
	int64_t i, j;
	for(i = 0; i < this->fFront; i++){
		if(this->fGlobal[i] != -1) from.Push(i);
	}
	
	/**
	 *First this->fLocal initialization
	 *Any needed updates is done on next loop
	 */
	nfound = from.NElements();
	for(i=0;i<nfound;i++) {
		this->fGlobal[i]=this->fGlobal[from[i]];
		//fGlobal[from[i]] = -1;
		this->fLocal[this->fGlobal[i]] = i;
	}
	for(;i<this->fGlobal.NElements();i++) this->fGlobal[i] = -1;
	
	if(nfound+this->fFree.NElements()!=this->fFront) cout << "TPZFront.Compress inconsistent data structure\n";
	int frontold = this->fFront;
	this->fFront = nfound;
	this->fFree.Resize(0);	
	this->fGlobal.Resize(this->fFront);
	if(this->fData.NElements()==0) return;
	
	for(j = 0; j < nfound; j++){
		for(i = 0; i <= j; i++){
			Element(i,j) = Element(from[i], from[j]);
		}
		//		fGlobal[i] = fGlobal[from[i]];
		//		this->fLocal[fGlobal[i]] = i;
	}
	for(;j<frontold;j++) {
		for(i=0;i<= j; i++) Element(i,j) = 0.;
	}
	
	//	Print("After Compress", cout);
	//	PrintGlobal("After Compress",output);
}